

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::cmLocalNinjaGenerator
          (cmLocalNinjaGenerator *this,cmGlobalGenerator *gg,cmMakefile *mf)

{
  cmMakefile *mf_local;
  cmGlobalGenerator *gg_local;
  cmLocalNinjaGenerator *this_local;
  
  cmLocalCommonGenerator::cmLocalCommonGenerator(&this->super_cmLocalCommonGenerator,gg,mf);
  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
  _vptr_cmOutputConverter = (_func_int **)&PTR__cmLocalNinjaGenerator_0167b688;
  std::__cxx11::string::string((string *)&this->HomeRelativeOutputPath);
  std::
  map<const_cmCustomCommand_*,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>,_std::less<const_cmCustomCommand_*>,_std::allocator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>_>
  ::map(&this->CustomCommandTargets);
  std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::vector
            (&this->CustomCommands);
  return;
}

Assistant:

cmLocalNinjaGenerator::cmLocalNinjaGenerator(cmGlobalGenerator* gg,
                                             cmMakefile* mf)
  : cmLocalCommonGenerator(gg, mf)
{
}